

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O3

void __thiscall
cmCPackIFWRepository::WriteRepositoryUpdate(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  Action AVar1;
  long lVar2;
  char *name;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Repository","");
  cmXMLWriter::StartElement(xout,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  AVar1 = this->Update;
  if (AVar1 == Add) {
    cmXMLWriter::Attribute<char[4]>(xout,"action",(char (*) [4])0x701409);
LAB_00193589:
    AVar1 = this->Update;
  }
  else {
    if (AVar1 == Remove) {
      cmXMLWriter::Attribute<char[7]>(xout,"action",(char (*) [7])0x7013eb);
      goto LAB_00193589;
    }
    if (AVar1 == Replace) {
      cmXMLWriter::Attribute<char[8]>(xout,"action",(char (*) [8])"replace");
      goto LAB_00193589;
    }
  }
  if (AVar1 - Add < 2) {
    name = "url";
    lVar2 = 0x30;
  }
  else {
    if (AVar1 != Replace) goto LAB_001935d2;
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"oldUrl",&this->OldUrl);
    name = "newUrl";
    lVar2 = 0x70;
  }
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xout,name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(this->super_cmCPackIFWCommon).Generator + lVar2));
LAB_001935d2:
  if ((this->Enabled)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"enabled",&this->Enabled);
  }
  if ((this->Username)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"username",&this->Username);
  }
  if ((this->Password)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"password",&this->Password);
  }
  if ((this->DisplayName)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"displayname",&this->DisplayName);
  }
  cmXMLWriter::EndElement(xout);
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryUpdate(cmXMLWriter& xout) const
{
  xout.StartElement("Repository");

  switch (this->Update) {
    case cmCPackIFWRepository::None:
      break;
    case cmCPackIFWRepository::Add:
      xout.Attribute("action", "add");
      break;
    case cmCPackIFWRepository::Remove:
      xout.Attribute("action", "remove");
      break;
    case cmCPackIFWRepository::Replace:
      xout.Attribute("action", "replace");
      break;
  }

  // Url
  if (this->Update == cmCPackIFWRepository::Add ||
      this->Update == cmCPackIFWRepository::Remove) {
    xout.Attribute("url", this->Url);
  } else if (this->Update == cmCPackIFWRepository::Replace) {
    xout.Attribute("oldUrl", this->OldUrl);
    xout.Attribute("newUrl", this->NewUrl);
  }
  // Enabled
  if (!this->Enabled.empty()) {
    xout.Attribute("enabled", this->Enabled);
  }
  // Username
  if (!this->Username.empty()) {
    xout.Attribute("username", this->Username);
  }
  // Password
  if (!this->Password.empty()) {
    xout.Attribute("password", this->Password);
  }
  // DisplayName
  if (!this->DisplayName.empty()) {
    xout.Attribute("displayname", this->DisplayName);
  }

  xout.EndElement();
}